

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

FilterPropagateResult duckdb::CheckRowIdFilter(TableFilter *filter,idx_t beg_row,idx_t end_row)

{
  int iVar1;
  LogicalType local_90;
  BaseStatistics dummy_stats;
  
  LogicalType::LogicalType(&local_90,BIGINT);
  NumericStats::CreateEmpty(&dummy_stats,&local_90);
  LogicalType::~LogicalType(&local_90);
  NumericStats::SetMin<long>(&dummy_stats,beg_row);
  NumericStats::SetMax<long>(&dummy_stats,end_row);
  iVar1 = (*filter->_vptr_TableFilter[2])(filter,&dummy_stats);
  BaseStatistics::~BaseStatistics(&dummy_stats);
  return (FilterPropagateResult)iVar1;
}

Assistant:

static FilterPropagateResult CheckRowIdFilter(TableFilter &filter, idx_t beg_row, idx_t end_row) {
	// RowId columns dont have a zonemap, but we can trivially create stats to check the filter against.
	BaseStatistics dummy_stats = NumericStats::CreateEmpty(LogicalType::ROW_TYPE);
	NumericStats::SetMin(dummy_stats, UnsafeNumericCast<row_t>(beg_row));
	NumericStats::SetMax(dummy_stats, UnsafeNumericCast<row_t>(end_row));

	return filter.CheckStatistics(dummy_stats);
}